

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldCex.c
# Opt level: O2

Vec_Int_t * Saig_ManCbaPerform(Aig_Man_t *pAbs,int nInputs,Saig_ParBmc_t *pPars)

{
  uint uVar1;
  int iVar2;
  abctime aVar3;
  Vec_Int_t *pVVar4;
  abctime aVar5;
  Abc_Cex_t *p;
  
  aVar3 = Abc_Clock();
  iVar2 = Saig_ManBmcScalable(pAbs,pPars);
  if (iVar2 == -1) {
    puts("Resource limit is reached during BMC.");
    if (pAbs->pSeqModel != (Abc_Cex_t *)0x0) {
      __assert_fail("pAbs->pSeqModel == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absOldCex.c"
                    ,0x349,"Vec_Int_t *Saig_ManCbaPerform(Aig_Man_t *, int, Saig_ParBmc_t *)");
    }
  }
  else {
    p = pAbs->pSeqModel;
    if (p != (Abc_Cex_t *)0x0) {
      if (pPars->fVerbose == 0) {
        iVar2 = 0;
      }
      else {
        Abc_CexPrintStats(p);
        p = pAbs->pSeqModel;
        iVar2 = pPars->fVerbose;
      }
      pVVar4 = Saig_ManCbaFilterInputs(pAbs,nInputs,p,iVar2);
      uVar1 = pVVar4->nSize;
      if (uVar1 == 0) {
        Vec_IntFree(pVVar4);
        pVVar4 = (Vec_Int_t *)0x0;
      }
      else if (pPars->fVerbose != 0) {
        iVar2 = 0x786e51;
        printf("Adding %d registers to the abstraction (total = %d).  ",(ulong)uVar1,
               (ulong)(pAbs->nRegs + uVar1));
        aVar5 = Abc_Clock();
        Abc_Print(iVar2,"%s =","Time");
        Abc_Print(iVar2,"%9.2f sec\n",(double)(aVar5 - aVar3) / 1000000.0);
      }
      return pVVar4;
    }
    puts("BMC did not detect a CEX with the given depth.");
  }
  pVVar4 = Vec_IntAlloc(0);
  return pVVar4;
}

Assistant:

Vec_Int_t * Saig_ManCbaPerform( Aig_Man_t * pAbs, int nInputs, Saig_ParBmc_t * pPars )
{
    Vec_Int_t * vAbsFfsToAdd;
    int RetValue;
    abctime clk = Abc_Clock();
//    assert( pAbs->nRegs > 0 );
    // perform BMC
    RetValue = Saig_ManBmcScalable( pAbs, pPars );
    if ( RetValue == -1 ) // time out - nothing to add
    {
        printf( "Resource limit is reached during BMC.\n" );
        assert( pAbs->pSeqModel == NULL );
        return Vec_IntAlloc( 0 );
    }
    if ( pAbs->pSeqModel == NULL )
    {
        printf( "BMC did not detect a CEX with the given depth.\n" );
        return Vec_IntAlloc( 0 );
    }
    if ( pPars->fVerbose )
        Abc_CexPrintStats( pAbs->pSeqModel );
    // CEX is detected - refine the flops
    vAbsFfsToAdd = Saig_ManCbaFilterInputs( pAbs, nInputs, pAbs->pSeqModel, pPars->fVerbose );
    if ( Vec_IntSize(vAbsFfsToAdd) == 0 )
    {
        Vec_IntFree( vAbsFfsToAdd );
        return NULL;
    }
    if ( pPars->fVerbose )
    {
        printf( "Adding %d registers to the abstraction (total = %d).  ", 
            Vec_IntSize(vAbsFfsToAdd), Aig_ManRegNum(pAbs)+Vec_IntSize(vAbsFfsToAdd) );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
    return vAbsFfsToAdd;
}